

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag_quad_thresh.c
# Opt level: O0

void fit_line(line_fit_pt *lfps,int sz,int i0,int i1,double *lineparm,double *err,double *mse)

{
  int iVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double length;
  double M;
  double ny;
  double nx;
  double M2;
  double ny2;
  double nx2;
  double M1;
  double ny1;
  double nx1;
  double eig;
  double eig_small;
  double Cyy;
  double Cxy;
  double Cxx;
  double Ey;
  double Ex;
  double dStack_60;
  int N;
  double W;
  double Mxy;
  double Myy;
  double Mxx;
  double My;
  double Mx;
  double *err_local;
  double *lineparm_local;
  int i1_local;
  int i0_local;
  int sz_local;
  line_fit_pt *lfps_local;
  
  if (i0 == i1) {
    __assert_fail("i0 != i1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0x7f,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  if ((((i0 < 0) || (i1 < 0)) || (sz <= i0)) || (sz <= i1)) {
    __assert_fail("i0 >= 0 && i1 >= 0 && i0 < sz && i1 < sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0x80,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  if (i0 < i1) {
    iVar1 = -i0;
    My = lfps[i1].Mx;
    Mxx = lfps[i1].My;
    Myy = lfps[i1].Mxx;
    W = lfps[i1].Mxy;
    Mxy = lfps[i1].Myy;
    dStack_60 = lfps[i1].W;
    if (0 < i0) {
      My = My - lfps[i0 + -1].Mx;
      Mxx = Mxx - lfps[i0 + -1].My;
      Myy = Myy - lfps[i0 + -1].Mxx;
      W = W - lfps[i0 + -1].Mxy;
      Mxy = Mxy - lfps[i0 + -1].Myy;
      dStack_60 = dStack_60 - lfps[i0 + -1].W;
    }
  }
  else {
    if (i0 < 1) {
      __assert_fail("i0 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                    ,0x9a,
                    "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                   );
    }
    My = lfps[i1].Mx + (lfps[sz + -1].Mx - lfps[i0 + -1].Mx);
    Mxx = lfps[i1].My + (lfps[sz + -1].My - lfps[i0 + -1].My);
    Myy = lfps[i1].Mxx + (lfps[sz + -1].Mxx - lfps[i0 + -1].Mxx);
    W = lfps[i1].Mxy + (lfps[sz + -1].Mxy - lfps[i0 + -1].Mxy);
    Mxy = lfps[i1].Myy + (lfps[sz + -1].Myy - lfps[i0 + -1].Myy);
    dStack_60 = lfps[i1].W + (lfps[sz + -1].W - lfps[i0 + -1].W);
    iVar1 = sz - i0;
  }
  Ex._4_4_ = i1 + iVar1 + 1;
  if (Ex._4_4_ < 2) {
    __assert_fail("N >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/apriltag_quad_thresh.c"
                  ,0xad,
                  "void fit_line(struct line_fit_pt *, int, int, int, double *, double *, double *)"
                 );
  }
  dVar3 = My / dStack_60;
  dVar4 = Mxx / dStack_60;
  dVar5 = -dVar3 * dVar3 + Myy / dStack_60;
  ny = -dVar3 * dVar4 + W / dStack_60;
  dVar6 = -dVar4 * dVar4 + Mxy / dStack_60;
  fVar2 = sqrtf((float)((dVar5 - dVar6) * (dVar5 - dVar6) + ny * 4.0 * ny));
  dVar7 = ((dVar5 + dVar6) - (double)fVar2) * 0.5;
  if (lineparm != (double *)0x0) {
    *lineparm = dVar3;
    lineparm[1] = dVar4;
    fVar2 = sqrtf((float)((dVar5 - dVar6) * (dVar5 - dVar6) + ny * 4.0 * ny));
    dVar3 = (dVar5 + dVar6 + (double)fVar2) * 0.5;
    dVar5 = dVar5 - dVar3;
    dVar4 = dVar5 * dVar5 + ny * ny;
    M = dVar6 - dVar3;
    length = ny * ny + M * M;
    if (length < dVar4) {
      length = dVar4;
      M = ny;
      ny = dVar5;
    }
    fVar2 = sqrtf((float)length);
    lineparm[2] = ny / (double)fVar2;
    lineparm[3] = M / (double)fVar2;
  }
  if (err != (double *)0x0) {
    *err = (double)Ex._4_4_ * dVar7;
  }
  if (mse != (double *)0x0) {
    *mse = dVar7;
  }
  return;
}

Assistant:

void fit_line(struct line_fit_pt *lfps, int sz, int i0, int i1, double *lineparm, double *err, double *mse)
{
    assert(i0 != i1);
    assert(i0 >= 0 && i1 >= 0 && i0 < sz && i1 < sz);

    double Mx, My, Mxx, Myy, Mxy, W;
    int N; // how many points are included in the set?

    if (i0 < i1) {
        N = i1 - i0 + 1;

        Mx  = lfps[i1].Mx;
        My  = lfps[i1].My;
        Mxx = lfps[i1].Mxx;
        Mxy = lfps[i1].Mxy;
        Myy = lfps[i1].Myy;
        W   = lfps[i1].W;

        if (i0 > 0) {
            Mx  -= lfps[i0-1].Mx;
            My  -= lfps[i0-1].My;
            Mxx -= lfps[i0-1].Mxx;
            Mxy -= lfps[i0-1].Mxy;
            Myy -= lfps[i0-1].Myy;
            W   -= lfps[i0-1].W;
        }

    } else {
        // i0 > i1, e.g. [15, 2]. Wrap around.
        assert(i0 > 0);

        Mx  = lfps[sz-1].Mx   - lfps[i0-1].Mx;
        My  = lfps[sz-1].My   - lfps[i0-1].My;
        Mxx = lfps[sz-1].Mxx  - lfps[i0-1].Mxx;
        Mxy = lfps[sz-1].Mxy  - lfps[i0-1].Mxy;
        Myy = lfps[sz-1].Myy  - lfps[i0-1].Myy;
        W   = lfps[sz-1].W    - lfps[i0-1].W;

        Mx  += lfps[i1].Mx;
        My  += lfps[i1].My;
        Mxx += lfps[i1].Mxx;
        Mxy += lfps[i1].Mxy;
        Myy += lfps[i1].Myy;
        W   += lfps[i1].W;

        N = sz - i0 + i1 + 1;
    }

    assert(N >= 2);

    double Ex = Mx / W;
    double Ey = My / W;
    double Cxx = Mxx / W - Ex*Ex;
    double Cxy = Mxy / W - Ex*Ey;
    double Cyy = Myy / W - Ey*Ey;

    //if (1) {
    //    // on iOS about 5% of total CPU spent in these trig functions.
    //    // 85 ms per frame on 5S, example.pnm
    //    //
    //    // XXX this was using the double-precision atan2. Was there a case where
    //    // we needed that precision? Seems doubtful.
    //    double normal_theta = .5 * atan2f(-2*Cxy, (Cyy - Cxx));
    //    nx_old = cosf(normal_theta);
    //    ny_old = sinf(normal_theta);
    //}
    
    // Instead of using the above cos/sin method, pose it as an eigenvalue problem.
    double eig_small = 0.5*(Cxx + Cyy - sqrtf((Cxx - Cyy)*(Cxx - Cyy) + 4*Cxy*Cxy));

    if (lineparm) {
        lineparm[0] = Ex;
        lineparm[1] = Ey;

        double eig = 0.5*(Cxx + Cyy + sqrtf((Cxx - Cyy)*(Cxx - Cyy) + 4*Cxy*Cxy));
        double nx1 = Cxx - eig;
        double ny1 = Cxy;
        double M1 = nx1*nx1 + ny1*ny1;
        double nx2 = Cxy;
        double ny2 = Cyy - eig;
        double M2 = nx2*nx2 + ny2*ny2;

        double nx, ny, M;
        if (M1 > M2) {
            nx = nx1;
            ny = ny1;
            M = M1;
        } else {
            nx = nx2;
            ny = ny2;
            M = M2;
        }

        double length = sqrtf(M);
        lineparm[2] = nx/length;
        lineparm[3] = ny/length;
    }

    // sum of squared errors =
    //
    // SUM_i ((p_x - ux)*nx + (p_y - uy)*ny)^2
    // SUM_i  nx*nx*(p_x - ux)^2 + 2nx*ny(p_x -ux)(p_y-uy) + ny*ny*(p_y-uy)*(p_y-uy)
    //  nx*nx*SUM_i((p_x -ux)^2) + 2nx*ny*SUM_i((p_x-ux)(p_y-uy)) + ny*ny*SUM_i((p_y-uy)^2)
    //
    //  nx*nx*N*Cxx + 2nx*ny*N*Cxy + ny*ny*N*Cyy

    // sum of squared errors
    if (err)
        *err = N*eig_small;

    // mean squared error
    if (mse)
        *mse = eig_small;
}